

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::BaseBuilder::newEmbedDataNode
          (BaseBuilder *this,EmbedDataNode **out,TypeId typeId,void *data,size_t itemCount,
          size_t repeatCount)

{
  EmbedDataNode EVar1;
  undefined1 auVar2 [16];
  char cVar3;
  Error extraout_EAX;
  Error EVar4;
  Error EVar5;
  ulong uVar6;
  EmbedDataNode *pEVar7;
  EmbedDataNode *pEVar8;
  EmbedDataNode *__dest;
  size_t unaff_R12;
  EmbedDataNode **local_50;
  ulong local_48;
  size_t local_38;
  
  *out = (EmbedDataNode *)0x0;
  cVar3 = (((this->super_BaseEmitter)._environment._arch & k32BitMask) == kUnknown) * '\x02' +
          '\x06';
  if ((typeId & 0xfe) != _kBaseStart) {
    cVar3 = '\0';
  }
  if (0x44 < (byte)((cVar3 + typeId) - 0x20)) {
    EVar5 = 2;
LAB_00116ba1:
    EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,EVar5,(char *)0x0);
    return EVar5;
  }
  EVar1 = *(EmbedDataNode *)(TypeUtils::_typeData + (ulong)(byte)(cVar3 + typeId) + 0x100);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = itemCount;
  auVar2 = auVar2 * ZEXT116((byte)EVar1);
  uVar6 = auVar2._0_8_;
  if (auVar2._8_8_ != 0) {
    EVar5 = 1;
    goto LAB_00116ba1;
  }
  if (*(long *)&this->_allocator == 0) {
    newEmbedDataNode();
    EVar5 = extraout_EAX;
  }
  else {
    pEVar7 = (EmbedDataNode *)ZoneAllocator::_alloc(&this->_allocator,0x80,&local_38);
    EVar4 = 0;
    unaff_R12 = repeatCount;
    EVar5 = 0;
    local_50 = out;
    local_48 = uVar6;
    if (pEVar7 != (EmbedDataNode *)0x0) {
      *(undefined8 *)pEVar7 = 0;
      *(undefined8 *)(pEVar7 + 8) = 0;
      pEVar7[0x10] = (EmbedDataNode)0x5;
      pEVar7[0x11] = (EmbedDataNode)(this->_nodeFlags | kIsData);
      *(undefined8 *)(pEVar7 + 0x12) = 0;
      *(undefined8 *)(pEVar7 + 0x1a) = 0;
      *(undefined8 *)(pEVar7 + 0x22) = 0;
      *(undefined8 *)(pEVar7 + 0x2a) = 0;
      *(undefined8 *)(pEVar7 + 0x30) = 0;
      *(undefined8 *)(pEVar7 + 0x38) = 0;
      *(undefined2 *)(pEVar7 + 0x12) = 0x123;
      *(undefined8 *)(pEVar7 + 0x40) = 0;
      *(undefined8 *)(pEVar7 + 0x48) = 0;
      *(undefined8 *)(pEVar7 + 0x50) = 0;
      *(undefined8 *)(pEVar7 + 0x58) = 0;
      *(undefined8 *)(pEVar7 + 0x60) = 0;
      *(undefined8 *)(pEVar7 + 0x68) = 0;
      *(undefined8 *)(pEVar7 + 0x70) = 0;
      *(undefined8 *)(pEVar7 + 0x78) = 0;
      goto LAB_00116ae2;
    }
  }
  EVar4 = EVar5;
  pEVar7 = (EmbedDataNode *)0x0;
LAB_00116ae2:
  if (pEVar7 == (EmbedDataNode *)0x0) {
    EVar4 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
  }
  if (EVar4 == 0) {
    pEVar7[0x12] = (EmbedDataNode)typeId;
    pEVar7[0x13] = EVar1;
    *(size_t *)(pEVar7 + 0x30) = itemCount;
    *(size_t *)(pEVar7 + 0x38) = unaff_R12;
    __dest = pEVar7 + 0x40;
    if (0x40 < local_48) {
      pEVar8 = (EmbedDataNode *)(*(long *)&this->_dataZone + 7U & 0xfffffffffffffff8);
      if ((pEVar8 < *(EmbedDataNode **)&this->field_0xc0) &&
         (local_48 <= (ulong)((long)*(EmbedDataNode **)&this->field_0xc0 - (long)pEVar8))) {
        *(EmbedDataNode **)&this->_dataZone = pEVar8 + local_48;
      }
      else {
        pEVar8 = (EmbedDataNode *)Zone::_alloc(&this->_dataZone,local_48,8);
      }
      if (pEVar8 == (EmbedDataNode *)0x0) {
        EVar5 = BaseEmitter::reportError(&this->super_BaseEmitter,1,(char *)0x0);
        return EVar5;
      }
      *(EmbedDataNode **)__dest = pEVar8;
      __dest = pEVar8;
    }
    if (data != (void *)0x0) {
      memcpy(__dest,data,local_48);
    }
    *local_50 = pEVar7;
    EVar4 = 0;
  }
  return EVar4;
}

Assistant:

Error BaseBuilder::newEmbedDataNode(EmbedDataNode** out, TypeId typeId, const void* data, size_t itemCount, size_t repeatCount) {
  *out = nullptr;

  uint32_t deabstractDelta = TypeUtils::deabstractDeltaOfSize(registerSize());
  TypeId finalTypeId = TypeUtils::deabstract(typeId, deabstractDelta);

  if (ASMJIT_UNLIKELY(!TypeUtils::isValid(finalTypeId)))
    return reportError(DebugUtils::errored(kErrorInvalidArgument));

  uint32_t typeSize = TypeUtils::sizeOf(finalTypeId);
  Support::FastUInt8 of = 0;

  size_t dataSize = Support::mulOverflow(itemCount, size_t(typeSize), &of);
  if (ASMJIT_UNLIKELY(of))
    return reportError(DebugUtils::errored(kErrorOutOfMemory));

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(_newNodeT<EmbedDataNode>(&node));

  node->_embed._typeId = typeId;
  node->_embed._typeSize = uint8_t(typeSize);
  node->_itemCount = itemCount;
  node->_repeatCount = repeatCount;

  uint8_t* dstData = node->_inlineData;
  if (dataSize > EmbedDataNode::kInlineBufferSize) {
    dstData = static_cast<uint8_t*>(_dataZone.alloc(dataSize, 8));
    if (ASMJIT_UNLIKELY(!dstData))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));
    node->_externalData = dstData;
  }

  if (data)
    memcpy(dstData, data, dataSize);

  *out = node;
  return kErrorOk;
}